

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageUtil.cpp
# Opt level: O0

void __thiscall
vkt::pipeline::TestTexture1DArray::TestTexture1DArray
          (TestTexture1DArray *this,CompressedTexFormat *format,int width,int arraySize)

{
  uint uVar1;
  int iVar2;
  value_type local_80;
  uint local_58;
  uint local_54;
  int layerNdx;
  int levelNdx;
  vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> layers;
  TextureFormat local_28;
  int local_20;
  int local_1c;
  int arraySize_local;
  int width_local;
  CompressedTexFormat *format_local;
  TestTexture1DArray *this_local;
  
  local_20 = arraySize;
  local_1c = width;
  _arraySize_local = format;
  format_local = (CompressedTexFormat *)this;
  TestTexture::TestTexture(&this->super_TestTexture,format,width,1,arraySize);
  (this->super_TestTexture)._vptr_TestTexture = (_func_int **)&PTR__TestTexture1DArray_01660d28;
  local_28 = tcu::getUncompressedFormat(*_arraySize_local);
  tcu::Texture1DArray::Texture1DArray(&this->m_texture,&local_28,local_1c,local_20);
  allocateLevels<tcu::Texture1DArray>(&this->m_texture);
  std::vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>::vector
            ((vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *)&layerNdx);
  local_54 = 0;
  while( true ) {
    uVar1 = local_54;
    iVar2 = tcu::TextureLevelPyramid::getNumLevels(&(this->m_texture).super_TextureLevelPyramid);
    if (iVar2 <= (int)uVar1) break;
    local_58 = 0;
    while( true ) {
      uVar1 = local_58;
      iVar2 = tcu::Texture1DArray::getNumLayers(&this->m_texture);
      if (iVar2 <= (int)uVar1) break;
      (*(this->super_TestTexture)._vptr_TestTexture[7])
                (&local_80,this,(ulong)local_54,(ulong)local_58);
      std::vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>::push_back
                ((vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *)
                 &layerNdx,&local_80);
      local_58 = local_58 + 1;
    }
    local_54 = local_54 + 1;
  }
  TestTexture::populateCompressedLevels
            (&this->super_TestTexture,*_arraySize_local,
             (vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *)&layerNdx);
  std::vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>::~vector
            ((vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *)&layerNdx);
  return;
}

Assistant:

TestTexture1DArray::TestTexture1DArray (const tcu::CompressedTexFormat& format, int width, int arraySize)
	: TestTexture	(format, width, 1, arraySize)
	, m_texture		(tcu::getUncompressedFormat(format), width, arraySize)
{
	allocateLevels(m_texture);

	std::vector<tcu::PixelBufferAccess> layers;
	for (int levelNdx = 0; levelNdx < m_texture.getNumLevels(); levelNdx++)
		for (int layerNdx = 0; layerNdx < m_texture.getNumLayers(); layerNdx++)
			layers.push_back(getLevel(levelNdx, layerNdx));

	TestTexture::populateCompressedLevels(format, layers);
}